

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O0

char * x_monnam(monst *mtmp,int article,char *adjective,int suppress,boolean called)

{
  permonst *pm;
  uint uVar1;
  boolean bVar2;
  byte bVar3;
  int iVar4;
  obj *poVar5;
  monst *mon;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  char local_478 [8];
  char buf2 [256];
  char pbuf_1 [256];
  char pbuf [256];
  char *name_1;
  long save_prop;
  char *name;
  char priestnambuf [256];
  monst *priestmon;
  char *bp;
  boolean has_adjectives;
  boolean name_at_start;
  boolean do_saddle;
  boolean do_it;
  boolean do_invis;
  boolean do_hallu;
  permonst *mdat;
  boolean called_local;
  int suppress_local;
  char *adjective_local;
  int article_local;
  monst *mtmp_local;
  
  pm = mtmp->data;
  mdat._4_4_ = suppress;
  if (program_state.gameover != 0) {
    mdat._4_4_ = suppress | 4;
  }
  adjective_local._4_4_ = article;
  if ((article == 3) && (mtmp->mtame == '\0')) {
    adjective_local._4_4_ = 1;
  }
  bVar9 = false;
  if ((u.uprops[0x23].intrinsic != 0) && (bVar9 = false, u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum != u.umonster) {
      bVar2 = dmgtype(youmonst.data,0x24);
      bVar9 = false;
      if (bVar2 != '\0') goto LAB_001a891d;
    }
    bVar9 = (mdat._4_4_ & 4) == 0;
  }
LAB_001a891d:
  bVar10 = (*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0;
  bVar11 = (mdat._4_4_ & 2) == 0;
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
        (((mtmp->data->mflags3 & 0x200) != 0 && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))))))
    goto LAB_001a8ac2;
LAB_001a8b57:
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
        (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
          (((((u.uprops[0x19].intrinsic != 0 ||
              ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
             (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)) &&
           (bVar12 = false, u.uprops[0x19].blocked == 0)))))) goto LAB_001a8dda;
      if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
        iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        bVar12 = false;
        if (iVar4 < 0x41) goto LAB_001a8dda;
      }
    }
    bVar12 = false;
    if ((u.uprops[0x42].intrinsic == 0) && (bVar12 = false, u.uprops[0x42].extrinsic == 0)) {
      bVar2 = match_warn_of_mon(mtmp);
      bVar12 = false;
      if (((bVar2 == '\0') &&
          (((bVar12 = false, adjective_local._4_4_ != 3 &&
            (bVar12 = false, program_state.gameover == 0)) && (bVar12 = false, mtmp != u.usteed))))
         && (((u._1052_1_ & 1) == 0 || (bVar12 = false, mtmp != u.ustuck)))) {
        bVar12 = (mdat._4_4_ & 1) == 0;
      }
    }
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 == '\0') goto LAB_001a8b57;
LAB_001a8ac2:
    if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
         (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
       ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) != 0 || ((*(uint *)&mtmp->field_0x60 >> 9 & 1) != 0)
         ) || (bVar12 = false, ((byte)u._1052_1_ >> 5 & 1) != 0)))) goto LAB_001a8b57;
  }
LAB_001a8dda:
  x_monnam::buf[0] = '\0';
  if (bVar12) {
    strcpy(x_monnam::buf,"it");
    mtmp_local = (monst *)x_monnam::buf;
    return (char *)mtmp_local;
  }
  if (((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) != 0) ||
     ((*(uint *)&mtmp->field_0x60 >> 0x1a & 1) != 0)) {
    mon = newmonst((uint)mtmp->mxtyp,(uint)mtmp->mnamelth);
    uVar1 = u.uprops[0x24].extrinsic;
    memcpy(mon,mtmp,(long)mtmp->mxlth + 0x78 + (ulong)mtmp->mnamelth);
    if (!bVar9) {
      u.uprops[0x24].extrinsic = 1;
    }
    if (!bVar10 || !bVar11) {
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfffffffd;
    }
    save_prop = (long)priestname(mon,(char *)&name);
    u.uprops[0x24].extrinsic = uVar1;
    if ((adjective_local._4_4_ == 0) && (iVar4 = strncmp((char *)save_prop,"the ",4), iVar4 == 0)) {
      save_prop = save_prop + 4;
    }
    strcpy(x_monnam::buf,(char *)save_prop);
    free(mon);
    mtmp_local = (monst *)x_monnam::buf;
    return (char *)mtmp_local;
  }
  if (((*(uint *)&mtmp->field_0x60 >> 0x19 & 1) != 0) && (!bVar9)) {
    if ((adjective != (char *)0x0) && (adjective_local._4_4_ == 1)) {
      strcpy(x_monnam::buf,"the ");
      pcVar6 = strcat(x_monnam::buf,adjective);
      strcat(pcVar6," ");
      pcVar6 = shkname(mtmp);
      strcat(x_monnam::buf,pcVar6);
      mtmp_local = (monst *)x_monnam::buf;
      return (char *)mtmp_local;
    }
    pcVar6 = shkname(mtmp);
    strcat(x_monnam::buf,pcVar6);
    if ((pm == mons + 0x11a) && (!bVar10 || !bVar11)) {
      mtmp_local = (monst *)x_monnam::buf;
      return (char *)mtmp_local;
    }
    strcat(x_monnam::buf," the ");
    if (bVar10 && bVar11) {
      strcat(x_monnam::buf,"invisible ");
    }
    pcVar6 = mons_mname(pm);
    strcat(x_monnam::buf,pcVar6);
    mtmp_local = (monst *)x_monnam::buf;
    return (char *)mtmp_local;
  }
  if (adjective != (char *)0x0) {
    pcVar6 = strcat(x_monnam::buf,adjective);
    strcat(pcVar6," ");
  }
  if (bVar10 && bVar11) {
    strcat(x_monnam::buf,"invisible ");
  }
  if (((((mdat._4_4_ & 8) == 0) && ((mtmp->misc_worn_check & 0x100000U) != 0)) &&
      (((u.uprops[0x1e].intrinsic == 0 &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) &&
     ((u.uprops[0x23].intrinsic == 0 ||
      ((u.uprops[0x24].extrinsic != 0 ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))))))) {
    strcat(x_monnam::buf,"saddled ");
  }
  bVar10 = x_monnam::buf[0] != '\0';
  if (bVar9) {
    pcVar6 = rndmonnam();
    strcat(x_monnam::buf,pcVar6);
    bVar9 = false;
    goto LAB_001a9732;
  }
  if (mtmp->mnamelth != '\0') {
    pcVar6 = (char *)((long)(mtmp->mtrack + 0x18) + (long)(int)mtmp->mxlth);
    if (pm == mons + 0x12a) {
      pcVar7 = eos(x_monnam::buf);
      pcVar6 = s_suffix(pcVar6);
      sprintf(pcVar7,"%s ghost",pcVar6);
      bVar9 = true;
    }
    else if (called == '\0') {
      if (((pm < mons + 0x159) || (mons + 0x168 < pm)) ||
         (pcVar7 = strstri(pcVar6," the "), pcVar7 == (char *)0x0)) {
        strcat(x_monnam::buf,pcVar6);
      }
      else {
        strcpy(pbuf_1 + 0xf8,pcVar6);
        pcVar7[(long)(pbuf_1 + (0xfd - (long)pcVar6))] = '\0';
        if (bVar10) {
          strcat(pbuf_1 + 0xf8,x_monnam::buf);
        }
        strcat(pbuf_1 + 0xf8,pcVar7 + 5);
        strcpy(x_monnam::buf,pbuf_1 + 0xf8);
        adjective_local._4_4_ = 0;
      }
      bVar9 = true;
    }
    else {
      pcVar7 = eos(x_monnam::buf);
      pcVar8 = mons_mname(pm);
      sprintf(pcVar7,"%s called %s",pcVar8,pcVar6);
      bVar9 = (pm->mflags2 & 0x80000) != 0;
    }
    goto LAB_001a9732;
  }
  if (((mons + 0x159 <= pm) && (pm <= mons + 0x168)) &&
     (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
    bVar3 = mtmp->m_lev;
    iVar4 = monsndx(pm);
    pcVar6 = rank_of((uint)bVar3,(short)iVar4,(byte)*(undefined4 *)&mtmp->field_0x60 & 1);
    strcpy(buf2 + 0xf8,pcVar6);
    pcVar6 = lcase(buf2 + 0xf8);
    strcat(x_monnam::buf,pcVar6);
    bVar9 = false;
    goto LAB_001a9732;
  }
  if ((((mtmp->data == mons + 0x144) || (mtmp->data == mons + 0x146)) ||
      (mtmp->data == mons + 0x145)) &&
     (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 2 < iVar4)) {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001a964b;
      if (((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))
            ) && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         (((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          ((mtmp->data->mflags3 & 0x200) != 0)))) {
        bVar3 = viz_array[mtmp->my][mtmp->mx] & 1;
        goto joined_r0x001a9645;
      }
    }
    else {
      bVar3 = worm_known(level,mtmp);
joined_r0x001a9645:
      if (bVar3 != 0) {
LAB_001a964b:
        if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
           ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))))
        goto LAB_001a96f8;
      }
    }
    if ((mdat._4_4_ & 1) == 0) {
      strcat(x_monnam::buf,"Rider");
      bVar9 = false;
      goto LAB_001a9732;
    }
  }
LAB_001a96f8:
  pcVar6 = mons_mname(pm);
  strcat(x_monnam::buf,pcVar6);
  bVar9 = (pm->mflags2 & 0x80000) != 0;
LAB_001a9732:
  if ((!bVar9) || ((adjective_local._4_4_ != 3 && (bVar10)))) {
    if (((pm->geno & 0x1000) != 0) && (adjective_local._4_4_ == 2)) {
      adjective_local._4_4_ = 1;
    }
  }
  else {
    adjective_local._4_4_ = (uint)(pm == mons + 0x128);
  }
  switch(adjective_local._4_4_) {
  case 0:
  default:
    mtmp_local = (monst *)x_monnam::buf;
    break;
  case 1:
    strcpy(local_478,"the ");
    strcat(local_478,x_monnam::buf);
    strcpy(x_monnam::buf,local_478);
    mtmp_local = (monst *)x_monnam::buf;
    break;
  case 2:
    mtmp_local = (monst *)an(x_monnam::buf);
    break;
  case 3:
    strcpy(local_478,"your ");
    strcat(local_478,x_monnam::buf);
    strcpy(x_monnam::buf,local_478);
    mtmp_local = (monst *)x_monnam::buf;
  }
  return (char *)mtmp_local;
}

Assistant:

char *x_monnam(const struct monst *mtmp,
	       int article, /* ARTICLE_NONE, ARTICLE_THE, ARTICLE_A: obvious
	                     * ARTICLE_YOUR: "your" on pets, "the" on everything
			     * else
			     * If the monster would be referred to as "it" or if the monster has a name
			     * _and_ there is no adjective, "invisible", "saddled", etc., override this
			     * and always use no article.
			     */
	       const char *adjective,
	       int suppress, /* SUPPRESS_IT, SUPPRESS_INVISIBLE, SUPPRESS_HALLUCINATION, SUPPRESS_SADDLE.
	                      * EXACT_NAME: combination of all the above
			      */
	       boolean called)
{
	static char buf[BUFSZ];

	const struct permonst *mdat = mtmp->data;
	boolean do_hallu, do_invis, do_it, do_saddle;
	boolean name_at_start, has_adjectives;
	char *bp;

	if (program_state.gameover)
	    suppress |= SUPPRESS_HALLUCINATION;
	if (article == ARTICLE_YOUR && !mtmp->mtame)
	    article = ARTICLE_THE;

	do_hallu = Hallucination && !(suppress & SUPPRESS_HALLUCINATION);
	do_invis = mtmp->minvis && !(suppress & SUPPRESS_INVISIBLE);
	do_it = !canspotmon(level, mtmp) &&
	    article != ARTICLE_YOUR &&
	    !program_state.gameover &&
	    mtmp != u.usteed &&
	    !(u.uswallow && mtmp == u.ustuck) &&
	    !(suppress & SUPPRESS_IT);
	do_saddle = !(suppress & SUPPRESS_SADDLE);

	buf[0] = 0;

	/* unseen monsters, etc.  Use "it" */
	if (do_it) {
	    strcpy(buf, "it");
	    return buf;
	}

	/* priests and minions: don't even use this function */
	if (mtmp->ispriest || mtmp->isminion) {
	    struct monst *priestmon = newmonst(mtmp->mxtyp, mtmp->mnamelth);
	    char priestnambuf[BUFSZ];
	    char *name;
	    long save_prop = EHalluc_resistance;
	    memcpy(priestmon, mtmp, sizeof(struct monst) + mtmp->mxlth + mtmp->mnamelth);

	    /* when true name is wanted, explicitly block Hallucination */
	    if (!do_hallu) EHalluc_resistance = 1L;
	    if (!do_invis) priestmon->minvis = 0;
	    name = priestname(priestmon, priestnambuf);
	    EHalluc_resistance = save_prop;
	    if (article == ARTICLE_NONE && !strncmp(name, "the ", 4))
		name += 4;
	    strcpy(buf, name);
	    free(priestmon);
	    return buf;
	}

	/* Shopkeepers: use shopkeeper name.  For normal shopkeepers, just
	 * "Asidonhopo"; for unusual ones, "Asidonhopo the invisible
	 * shopkeeper" or "Asidonhopo the blue dragon".  If hallucinating,
	 * none of this applies.
	 */
	if (mtmp->isshk && !do_hallu) {
	    if (adjective && article == ARTICLE_THE) {
		/* pathological case: "the angry Asidonhopo the blue dragon"
		   sounds silly */
		strcpy(buf, "the ");
		strcat(strcat(buf, adjective), " ");
		strcat(buf, shkname(mtmp));
		return buf;
	    }
	    strcat(buf, shkname(mtmp));
	    if (mdat == &mons[PM_SHOPKEEPER] && !do_invis)
		return buf;
	    strcat(buf, " the ");
	    if (do_invis)
		strcat(buf, "invisible ");
	    strcat(buf, mons_mname(mdat));
	    return buf;
	}

	/* Put the adjectives in the buffer */
	if (adjective)
	    strcat(strcat(buf, adjective), " ");
	if (do_invis)
	    strcat(buf, "invisible ");

	if (do_saddle && (mtmp->misc_worn_check & W_SADDLE) &&
	    !Blind && !Hallucination)
	    strcat(buf, "saddled ");

	if (buf[0] != 0)
	    has_adjectives = TRUE;
	else
	    has_adjectives = FALSE;

	/* Put the actual monster name or type into the buffer now */
	/* Be sure to remember whether the buffer starts with a name */
	if (do_hallu) {
	    strcat(buf, rndmonnam());
	    name_at_start = FALSE;
	} else if (mtmp->mnamelth) {
	    char *name = NAME(mtmp);

	    if (mdat == &mons[PM_GHOST]) {
		sprintf(eos(buf), "%s ghost", s_suffix(name));
		name_at_start = TRUE;
	    } else if (called) {
		sprintf(eos(buf), "%s called %s", mons_mname(mdat), name);
		name_at_start = (boolean)type_is_pname(mdat);
	    } else if (is_mplayer(mdat) && (bp = strstri(name, " the ")) != 0) {
		/* <name> the <adjective> <invisible> <saddled> <rank> */
		char pbuf[BUFSZ];

		strcpy(pbuf, name);
		pbuf[bp - name + 5] = '\0'; /* adjectives right after " the " */
		if (has_adjectives)
		    strcat(pbuf, buf);
		strcat(pbuf, bp + 5);	/* append the rest of the name */
		strcpy(buf, pbuf);
		article = ARTICLE_NONE;
		name_at_start = TRUE;
	    } else {
		strcat(buf, name);
		name_at_start = TRUE;
	    }
	} else if (is_mplayer(mdat) && !In_endgame(&u.uz)) {
	    char pbuf[BUFSZ];
	    strcpy(pbuf, rank_of((int)mtmp->m_lev,
				 monsndx(mdat), (boolean)mtmp->female));
	    strcat(buf, lcase(pbuf));
	    name_at_start = FALSE;
	} else if (is_rider(mtmp->data) &&
		   distu(mtmp->mx, mtmp->my) > 2 &&
		   !canseemon(level, mtmp) &&
		   /* for livelog reporting */
		   !(suppress & SUPPRESS_IT)) {
	    /* prevent the three horsemen from being identified from afar */
	    strcat(buf, "Rider");
	    name_at_start = FALSE;
	} else {
	    strcat(buf, mons_mname(mdat));
	    name_at_start = (boolean)type_is_pname(mdat);
	}

	if (name_at_start && (article == ARTICLE_YOUR || !has_adjectives)) {
	    if (mdat == &mons[PM_WIZARD_OF_YENDOR])
		article = ARTICLE_THE;
	    else
		article = ARTICLE_NONE;
	} else if ((mdat->geno & G_UNIQ) && article == ARTICLE_A) {
	    article = ARTICLE_THE;
	}

	{
	    char buf2[BUFSZ];

	    switch(article) {
		case ARTICLE_YOUR:
		    strcpy(buf2, "your ");
		    strcat(buf2, buf);
		    strcpy(buf, buf2);
		    return buf;
		case ARTICLE_THE:
		    strcpy(buf2, "the ");
		    strcat(buf2, buf);
		    strcpy(buf, buf2);
		    return buf;
		case ARTICLE_A:
		    return an(buf);
		case ARTICLE_NONE:
		default:
		    return buf;
	    }
	}
}